

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError add_url(GlobalConfig *global,OperationConfig *config,char *thisurl,int extraflags)

{
  ulong uVar1;
  bool bVar2;
  getout *local_38;
  getout *url;
  ParameterError err;
  int extraflags_local;
  char *thisurl_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  if (config->url_get == (getout *)0x0) {
    config->url_get = config->url_list;
  }
  if (config->url_get != (getout *)0x0) {
    while( true ) {
      bVar2 = false;
      if (config->url_get != (getout *)0x0) {
        bVar2 = (config->url_get->flags & 2U) != 0;
      }
      if (!bVar2) break;
      config->url_get = config->url_get->next;
    }
  }
  if (config->url_get == (getout *)0x0) {
    local_38 = new_getout(config);
    config->url_get = local_38;
  }
  else {
    local_38 = config->url_get;
  }
  if (local_38 == (getout *)0x0) {
    global_local._4_4_ = PARAM_NO_MEM;
  }
  else {
    global_local._4_4_ = getstr(&local_38->url,thisurl,false);
    local_38->flags = extraflags | 2U | local_38->flags;
    if (((global_local._4_4_ == PARAM_OK) &&
        (uVar1 = config->num_urls + 1, config->num_urls = uVar1, 1 < uVar1)) &&
       ((config->etag_save_file != (char *)0x0 || (config->etag_compare_file != (char *)0x0)))) {
      errorf(global,"The etag options only work on a single URL");
      global_local._4_4_ = PARAM_BAD_USE;
    }
  }
  return global_local._4_4_;
}

Assistant:

static ParameterError add_url(struct GlobalConfig *global,
                              struct OperationConfig *config,
                              const char *thisurl,
                              int extraflags)
{
  ParameterError err = PARAM_OK;
  struct getout *url;

  if(!config->url_get)
    config->url_get = config->url_list;

  if(config->url_get) {
    /* there is a node here, if it already is filled-in continue to find
       an "empty" node */
    while(config->url_get && (config->url_get->flags & GETOUT_URL))
      config->url_get = config->url_get->next;
  }

  /* now there might or might not be an available node to fill in! */

  if(config->url_get)
    /* existing node */
    url = config->url_get;
  else
    /* there was no free node, create one! */
    config->url_get = url = new_getout(config);

  if(!url)
    return PARAM_NO_MEM;
  else {
    /* fill in the URL */
    err = getstr(&url->url, thisurl, DENY_BLANK);
    url->flags |= GETOUT_URL | extraflags;
    if(!err && (++config->num_urls > 1) &&
       (config->etag_save_file || config->etag_compare_file)) {
      errorf(global, "The etag options only work on a single URL");
      return PARAM_BAD_USE;
    }
  }
  return err;
}